

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O1

void duckdb::UDFWrapper::RegisterFunction<long,long>
               (string *name,scalar_function_t *udf_function,ClientContext *context,
               LogicalType *varargs)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  LogicalType ret_type;
  vector<duckdb::LogicalType,_true> arguments;
  LogicalType local_e0 [24];
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type local_b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  LogicalType local_90 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  LogicalType local_40 [24];
  
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_e0,BIGINT);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>(&local_a8,local_e0);
  duckdb::LogicalType::~LogicalType(local_e0);
  duckdb::LogicalType::LogicalType(local_e0,BIGINT);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + name->_M_string_length);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,&local_a8);
  duckdb::LogicalType::LogicalType(local_90,local_e0);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  local_b0 = udf_function->_M_invoker;
  p_Var2 = (udf_function->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_c8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(udf_function->super__Function_base)._M_functor;
    local_c8._8_8_ = *(undefined8 *)((long)&(udf_function->super__Function_base)._M_functor + 8);
    (udf_function->super__Function_base)._M_manager = (_Manager_type)0x0;
    udf_function->_M_invoker = (_Invoker_type)0x0;
    local_b8 = p_Var2;
  }
  duckdb::LogicalType::LogicalType(local_40,varargs);
  duckdb::UDFWrapper::RegisterFunction(local_60,&local_78,local_90,&local_c8,context,local_40);
  duckdb::LogicalType::~LogicalType(local_40);
  if (local_b8 != (_Manager_type)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  duckdb::LogicalType::~LogicalType(local_e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a8);
  return;
}

Assistant:

inline static void RegisterFunction(const string &name, scalar_function_t udf_function, ClientContext &context,
	                                    LogicalType varargs = LogicalType(LogicalTypeId::INVALID)) {
		vector<LogicalType> arguments;
		GetArgumentTypesRecursive<ARGS...>(arguments);

		LogicalType ret_type = GetArgumentType<TR>();

		RegisterFunction(name, arguments, ret_type, std::move(udf_function), context, std::move(varargs));
	}